

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O2

void __thiscall
MipTimer::csvEvaluateRootNodeClock
          (MipTimer *this,string *model_name,HighsTimerClock *mip_timer_clock,bool header,
          bool end_line)

{
  initializer_list<int> __l;
  allocator_type local_d9;
  _Vector_base<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> mip_clock_list;
  string local_a8;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0x200000001f;
  uStack_30 = 0x2200000021;
  local_48 = 0x1c0000001b;
  uStack_40 = 0x1e0000001d;
  local_58 = 0x1800000017;
  uStack_50 = 0x1a00000019;
  local_68 = 0x1400000013;
  uStack_60 = 0x1600000015;
  __l._M_len = 0x10;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&mip_clock_list,__l,&local_d9);
  std::__cxx11::string::string((string *)&local_88,"csvRootNode",(allocator *)&local_68);
  std::__cxx11::string::string((string *)&local_a8,(string *)model_name);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_d8,&mip_clock_list);
  csvMipClockList(this,&local_88,&local_a8,(vector<int,_std::allocator<int>_> *)&local_d8,
                  mip_timer_clock,8,header,end_line);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&mip_clock_list.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void csvEvaluateRootNodeClock(const std::string model_name,
                                const HighsTimerClock& mip_timer_clock,
                                const bool header, const bool end_line) {
    const std::vector<HighsInt> mip_clock_list{
        kMipClockStartSymmetryDetection,
        kMipClockStartAnalyticCentreComputation,
        kMipClockEvaluateRootLp,
        kMipClockSeparateLpCuts,
        kMipClockRandomizedRounding,
        kMipClockPerformRestart,
        kMipClockRootSeparation,
        kMipClockFinishAnalyticCentreComputation,
        kMipClockRootCentralRounding,
        kMipClockRootSeparationRound0,
        kMipClockRootHeuristicsReducedCost,
        kMipClockRootSeparationRound1,
        kMipClockRootHeuristicsRens,
        kMipClockRootSeparationRound2,
        kMipClockRootFeasibilityPump,
        kMipClockRootSeparationRound3};
    csvMipClockList("csvRootNode", model_name, mip_clock_list, mip_timer_clock,
                    kMipClockEvaluateRootNode, header, end_line);
  }